

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O2

bool Fossilize::pnext_chain_json_value<rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
               (void *pNext,MemoryPoolAllocator<rapidjson::CrtAllocator> *alloc,Value *out_value,
               DynamicStateInfo *dynamic_state_info)

{
  VkPipeline *ppVVar1;
  bool bVar2;
  VkStructureType VVar3;
  VkPipelineLibraryCreateInfoKHR *create_info;
  uint32_t value_00;
  VkImageLayout value_01;
  uint uVar4;
  StringRefType *pSVar5;
  StringRefType *pSVar6;
  uint32_t i;
  ulong uVar7;
  long lVar8;
  ulong uVar9;
  uint32_t i_3;
  uint32_t i_14;
  Value value;
  Value extent;
  Value comp;
  Value att;
  Value range;
  Value discardRectangles;
  Value next;
  Value combinerOps;
  Data local_d8;
  Value loc;
  StringRefType local_b8;
  Value loc_1;
  StringRefType local_98;
  DynamicStateInfo *local_88;
  Data *local_80;
  ulong local_78;
  StringRefType local_70;
  StringRefType local_60;
  string local_50;
  
  local_d8.n.i64 = (Number)0x0;
  local_d8.s.str = (Ch *)0x4000000000000;
  local_88 = dynamic_state_info;
  local_80 = &out_value->data_;
LAB_00147f44:
  create_info = (VkPipelineLibraryCreateInfoKHR *)pnext_chain_skip_ignored_entries(pNext);
  if (create_info == (VkPipelineLibraryCreateInfoKHR *)0x0) {
    if (&local_d8 != local_80) {
      local_80->n = local_d8.n;
      (&local_80->n)[1] = (Number)local_d8.s.str;
    }
LAB_0014a32b:
    return create_info == (VkPipelineLibraryCreateInfoKHR *)0x0;
  }
  next.data_.n = (Number)0x0;
  next.data_.s.str = (Ch *)0x0;
  VVar3 = create_info->sType;
  if (VVar3 == VK_STRUCTURE_TYPE_SHADER_MODULE_CREATE_INFO) goto LAB_0014a2ab;
  if (VVar3 == VK_STRUCTURE_TYPE_PIPELINE_RASTERIZATION_STATE_STREAM_CREATE_INFO_EXT) {
    value.data_.n = (Number)0x0;
    value.data_.s.str = (Ch *)0x3000000000000;
    comp.data_.n = (Number)((long)"opcodeEntry->hasType" + 0xf);
    comp.data_._8_4_ = 5;
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    AddMember<VkStructureType>(&value,(StringRefType *)&comp,create_info->sType,alloc);
    extent.data_.n = (Number)((long)"kernel enqeue flags" + 0xe);
    extent.data_._8_4_ = 5;
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    AddMember<unsigned_int>(&value,(StringRefType *)&extent,create_info->libraryCount,alloc);
    range.data_.n = (Number)anon_var_dwarf_413f4;
    range.data_._8_4_ = 0x13;
LAB_001484d3:
    uVar4 = *(uint *)&create_info->field_0x14;
    pSVar6 = (StringRefType *)&range;
LAB_0014a010:
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    AddMember<unsigned_int>(&value,pSVar6,uVar4,alloc);
LAB_0014a292:
    next.data_.n = value.data_.n;
    next.data_.s.str = value.data_.s.str;
  }
  else {
    if (VVar3 == VK_STRUCTURE_TYPE_PIPELINE_RENDERING_CREATE_INFO) {
      value.data_.n = (Number)0x0;
      value.data_.s.str = (Ch *)0x3000000000000;
      comp.data_.n = (Number)((long)"opcodeEntry->hasType" + 0xf);
      comp.data_._8_4_ = 5;
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::AddMember<VkStructureType>(&value,(StringRefType *)&comp,create_info->sType,alloc);
      extent.data_.n = (Number)anon_var_dwarf_414fc;
      extent.data_._8_4_ = 0x15;
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::AddMember<unsigned_int>(&value,(StringRefType *)&extent,create_info[1].sType,alloc);
      range.data_.n = (Number)anon_var_dwarf_41508;
      range.data_._8_4_ = 0x17;
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::AddMember<unsigned_int>
                (&value,(StringRefType *)&range,*(uint *)&create_info[1].field_0x4,alloc);
      att.data_.n = (Number)anon_var_dwarf_40ef2;
      att.data_._8_4_ = 8;
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::AddMember<unsigned_int>(&value,(StringRefType *)&att,create_info->libraryCount,alloc);
      uVar4 = *(uint *)&create_info->field_0x14;
      if (uVar4 != 0) {
        discardRectangles.data_.n = (Number)0x0;
        discardRectangles.data_.s.str = (Ch *)0x4000000000000;
        for (uVar7 = 0; uVar7 < uVar4; uVar7 = uVar7 + 1) {
          rapidjson::
          GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
          ::PushBack<unsigned_int>
                    (&discardRectangles,*(uint *)((long)create_info->pLibraries + uVar7 * 4),alloc);
          uVar4 = *(uint *)&create_info->field_0x14;
        }
        combinerOps.data_.n = (Number)anon_var_dwarf_41514;
        combinerOps.data_._8_4_ = 0x16;
        pSVar6 = (StringRefType *)&combinerOps;
        pSVar5 = (StringRefType *)&discardRectangles;
LAB_0014a1d4:
        rapidjson::
        GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
        ::AddMember(&value,pSVar6,
                    (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                     *)pSVar5,alloc);
      }
      goto LAB_0014a292;
    }
    if (VVar3 == VK_STRUCTURE_TYPE_RENDER_PASS_MULTIVIEW_CREATE_INFO) {
      value.data_.n = (Number)0x0;
      value.data_.s.str = (Ch *)0x3000000000000;
      comp.data_.n = (Number)((long)"opcodeEntry->hasType" + 0xf);
      comp.data_._8_4_ = 5;
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::AddMember<VkStructureType>(&value,(StringRefType *)&comp,create_info->sType,alloc);
      uVar4 = create_info->libraryCount;
      if (uVar4 != 0) {
        extent.data_.n = (Number)0x0;
        extent.data_.s.str = (Ch *)0x4000000000000;
        for (uVar7 = 0; uVar7 < uVar4; uVar7 = uVar7 + 1) {
          rapidjson::
          GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
          ::PushBack<unsigned_int>
                    (&extent,*(uint *)((long)create_info->pLibraries + uVar7 * 4),alloc);
          uVar4 = create_info->libraryCount;
        }
        range.data_.n = (Number)anon_var_dwarf_417f0;
        range.data_._8_4_ = 9;
        rapidjson::
        GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
        ::AddMember(&value,(StringRefType *)&range,&extent,alloc);
      }
      VVar3 = create_info[1].sType;
      if (VVar3 != VK_STRUCTURE_TYPE_APPLICATION_INFO) {
        extent.data_.n = (Number)0x0;
        extent.data_.s.str = (Ch *)0x4000000000000;
        for (uVar7 = 0; uVar7 < VVar3; uVar7 = uVar7 + 1) {
          rapidjson::
          GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
          ::PushBack<int>(&extent,*(int *)((long)create_info[1].pNext + uVar7 * 4),alloc);
          VVar3 = create_info[1].sType;
        }
        att.data_.n = (Number)anon_var_dwarf_417fc;
        att.data_._8_4_ = 0xb;
        rapidjson::
        GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
        ::AddMember(&value,(StringRefType *)&att,&extent,alloc);
      }
      uVar4 = create_info[1].libraryCount;
      if (uVar4 != 0) {
        extent.data_.n = (Number)0x0;
        extent.data_.s.str = (Ch *)0x4000000000000;
        for (uVar7 = 0; uVar7 < uVar4; uVar7 = uVar7 + 1) {
          rapidjson::
          GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
          ::PushBack<unsigned_int>
                    (&extent,*(uint *)((long)create_info[1].pLibraries + uVar7 * 4),alloc);
          uVar4 = create_info[1].libraryCount;
        }
        discardRectangles.data_.n = (Number)anon_var_dwarf_41808;
        discardRectangles.data_._8_4_ = 0x10;
        pSVar6 = (StringRefType *)&discardRectangles;
LAB_0014a1cf:
        pSVar5 = (StringRefType *)&extent;
        goto LAB_0014a1d4;
      }
      goto LAB_0014a292;
    }
    if (VVar3 == VK_STRUCTURE_TYPE_PIPELINE_ROBUSTNESS_CREATE_INFO) {
      value.data_.n = (Number)0x0;
      value.data_.s.str = (Ch *)0x3000000000000;
      comp.data_.n = (Number)((long)"opcodeEntry->hasType" + 0xf);
      comp.data_._8_4_ = 5;
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::AddMember<VkStructureType>(&value,(StringRefType *)&comp,create_info->sType,alloc);
      extent.data_.n = (Number)anon_var_dwarf_41748;
      extent.data_._8_4_ = 0xe;
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::AddMember<VkPipelineRobustnessBufferBehavior>
                (&value,(StringRefType *)&extent,create_info->libraryCount,alloc);
      range.data_.n = (Number)anon_var_dwarf_41754;
      range.data_._8_4_ = 0xc;
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::AddMember<VkPipelineRobustnessBufferBehavior>
                (&value,(StringRefType *)&range,
                 *(VkPipelineRobustnessBufferBehavior *)&create_info->pLibraries,alloc);
      att.data_.n = (Number)anon_var_dwarf_4173c;
      att.data_._8_4_ = 0xe;
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::AddMember<VkPipelineRobustnessBufferBehavior>
                (&value,(StringRefType *)&att,
                 *(VkPipelineRobustnessBufferBehavior *)&create_info->field_0x14,alloc);
      discardRectangles.data_.n = (Number)((long)"separate_images" + 9);
      discardRectangles.data_._8_4_ = 6;
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::AddMember<VkPipelineRobustnessImageBehavior>
                (&value,(StringRefType *)&discardRectangles,
                 *(VkPipelineRobustnessImageBehavior *)((long)&create_info->pLibraries + 4),alloc);
      goto LAB_0014a292;
    }
    if (VVar3 == VK_STRUCTURE_TYPE_PIPELINE_DISCARD_RECTANGLE_STATE_CREATE_INFO_EXT) {
      value.data_.n = (Number)0x0;
      value.data_.s.str = (Ch *)0x3000000000000;
      comp.data_.n = (Number)((long)"opcodeEntry->hasType" + 0xf);
      comp.data_._8_4_ = 5;
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::AddMember<VkStructureType>(&value,(StringRefType *)&comp,create_info->sType,alloc);
      extent.data_.n = (Number)((long)"kernel enqeue flags" + 0xe);
      extent.data_._8_4_ = 5;
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::AddMember<unsigned_int>(&value,(StringRefType *)&extent,create_info->libraryCount,alloc);
      range.data_.n = (Number)anon_var_dwarf_415bc;
      range.data_._8_4_ = 0x14;
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::AddMember<VkDiscardRectangleModeEXT>
                (&value,(StringRefType *)&range,
                 *(VkDiscardRectangleModeEXT *)&create_info->field_0x14,alloc);
      att.data_.n = (Number)anon_var_dwarf_415c8;
      att.data_._8_4_ = 0x15;
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::AddMember<unsigned_int>
                (&value,(StringRefType *)&att,*(uint *)&create_info->pLibraries,alloc);
      if ((local_88 != (DynamicStateInfo *)0x0) && (local_88->discard_rectangle == false)) {
        discardRectangles.data_.n = (Number)0x0;
        discardRectangles.data_.s.str = (Ch *)0x4000000000000;
        lVar8 = 0;
        uVar7 = 0;
        while (uVar7 < *(uint *)&create_info->pLibraries) {
          combinerOps.data_.n = (Number)0x0;
          combinerOps.data_.s.str = (Ch *)0x3000000000000;
          loc.data_.n = (Number)((long)"0x%x" + 3);
          loc.data_._8_4_ = 1;
          local_78 = uVar7;
          rapidjson::
          GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
          ::AddMember<int>(&combinerOps,(StringRefType *)&loc,
                           *(int *)(*(long *)(create_info + 1) + lVar8),alloc);
          local_b8.s = "y";
          local_b8.length = 1;
          rapidjson::
          GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
          ::AddMember<int>(&combinerOps,&local_b8,*(int *)(*(long *)(create_info + 1) + 4 + lVar8),
                           alloc);
          local_98.s = "width";
          local_98.length = 5;
          rapidjson::
          GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
          ::AddMember<unsigned_int>
                    (&combinerOps,&local_98,*(uint *)(*(long *)(create_info + 1) + 8 + lVar8),alloc)
          ;
          loc_1.data_.n = (Number)((long)"VK_AMD_negative_viewport_height" + 0x19);
          loc_1.data_._8_4_ = 6;
          rapidjson::
          GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
          ::AddMember<unsigned_int>
                    (&combinerOps,(StringRefType *)&loc_1,
                     *(uint *)(*(long *)(create_info + 1) + 0xc + lVar8),alloc);
          rapidjson::
          GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
          ::PushBack(&discardRectangles,&combinerOps,alloc);
          lVar8 = lVar8 + 0x10;
          uVar7 = local_78 + 1;
        }
        combinerOps.data_.n = (Number)anon_var_dwarf_415d4;
        combinerOps.data_._8_4_ = 0x11;
        rapidjson::
        GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
        ::AddMember(&value,(StringRefType *)&combinerOps,&discardRectangles,alloc);
      }
      goto LAB_0014a292;
    }
    if (VVar3 == VK_STRUCTURE_TYPE_PIPELINE_RASTERIZATION_CONSERVATIVE_STATE_CREATE_INFO_EXT) {
      value.data_.n = (Number)0x0;
      value.data_.s.str = (Ch *)0x3000000000000;
      comp.data_.n = (Number)((long)"opcodeEntry->hasType" + 0xf);
      comp.data_._8_4_ = 5;
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::AddMember<VkStructureType>(&value,(StringRefType *)&comp,create_info->sType,alloc);
      extent.data_.n = (Number)((long)"kernel enqeue flags" + 0xe);
      extent.data_._8_4_ = 5;
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::AddMember<unsigned_int>(&value,(StringRefType *)&extent,create_info->libraryCount,alloc);
      range.data_.n = (Number)anon_var_dwarf_41430;
      range.data_._8_4_ = 0x1d;
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::AddMember<VkConservativeRasterizationModeEXT>
                (&value,(StringRefType *)&range,
                 *(VkConservativeRasterizationModeEXT *)&create_info->field_0x14,alloc);
      att.data_.n = (Number)anon_var_dwarf_41448;
      att.data_._8_4_ = 0x20;
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::AddMember<float>(&value,(StringRefType *)&att,*(float *)&create_info->pLibraries,alloc);
      goto LAB_0014a292;
    }
    if (VVar3 == VK_STRUCTURE_TYPE_PIPELINE_RASTERIZATION_DEPTH_CLIP_STATE_CREATE_INFO_EXT) {
      value.data_.n = (Number)0x0;
      value.data_.s.str = (Ch *)0x3000000000000;
      comp.data_.n = (Number)((long)"opcodeEntry->hasType" + 0xf);
      comp.data_._8_4_ = 5;
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::AddMember<VkStructureType>(&value,(StringRefType *)&comp,create_info->sType,alloc);
      extent.data_.n = (Number)((long)"kernel enqeue flags" + 0xe);
      extent.data_._8_4_ = 5;
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::AddMember<unsigned_int>(&value,(StringRefType *)&extent,create_info->libraryCount,alloc);
      range.data_.n = (Number)anon_var_dwarf_413e8;
      range.data_._8_4_ = 0xf;
      goto LAB_001484d3;
    }
    if (VVar3 != VK_STRUCTURE_TYPE_RENDER_PASS_INPUT_ATTACHMENT_ASPECT_CREATE_INFO) {
      pSVar6 = (StringRefType *)&range;
      if (VVar3 == VK_STRUCTURE_TYPE_PIPELINE_VIEWPORT_DEPTH_CLAMP_CONTROL_CREATE_INFO_EXT) {
        value.data_.n = (Number)0x0;
        value.data_.s.str = (Ch *)0x3000000000000;
        comp.data_.n = (Number)((long)"opcodeEntry->hasType" + 0xf);
        comp.data_._8_4_ = 5;
        rapidjson::
        GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
        ::AddMember<VkStructureType>(&value,(StringRefType *)&comp,create_info->sType,alloc);
        extent.data_.n = (Number)anon_var_dwarf_41760;
        extent.data_._8_4_ = 0xe;
        rapidjson::
        GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
        ::AddMember<VkDepthClampModeEXT>
                  (&value,(StringRefType *)&extent,create_info->libraryCount,alloc);
        if (create_info->pLibraries != (VkPipeline *)0x0) {
          range.data_.n = (Number)0x0;
          range.data_.s.str = (Ch *)0x3000000000000;
          att.data_.n = (Number)anon_var_dwarf_41778;
          att.data_._8_4_ = 0xd;
          rapidjson::
          GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
          ::AddMember<float>((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                              *)&range,(StringRefType *)&att,*(float *)create_info->pLibraries,alloc
                            );
          discardRectangles.data_.n = (Number)anon_var_dwarf_41784;
          discardRectangles.data_._8_4_ = 0xd;
          rapidjson::
          GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
          ::AddMember<float>((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                              *)&range,(StringRefType *)&discardRectangles,
                             *(float *)((long)create_info->pLibraries + 4),alloc);
          combinerOps.data_.n = (Number)anon_var_dwarf_4176c;
          combinerOps.data_._8_4_ = 0xf;
          pSVar5 = (StringRefType *)&combinerOps;
          goto LAB_0014a28a;
        }
      }
      else if (VVar3 == VK_STRUCTURE_TYPE_SAMPLER_REDUCTION_MODE_CREATE_INFO) {
        value.data_.n = (Number)0x0;
        value.data_.s.str = (Ch *)0x3000000000000;
        comp.data_.n = (Number)((long)"opcodeEntry->hasType" + 0xf);
        comp.data_._8_4_ = 5;
        rapidjson::
        GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
        ::AddMember<VkStructureType>(&value,(StringRefType *)&comp,create_info->sType,alloc);
        extent.data_.n = (Number)anon_var_dwarf_41598;
        extent.data_._8_4_ = 0xd;
        rapidjson::
        GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
        ::AddMember<VkSamplerReductionMode>
                  (&value,(StringRefType *)&extent,create_info->libraryCount,alloc);
      }
      else {
        pSVar5 = (StringRefType *)&range;
        if (VVar3 == VK_STRUCTURE_TYPE_SAMPLE_LOCATIONS_INFO_EXT) {
          value.data_.n = (Number)0x0;
          value.data_.s.str = (Ch *)0x3000000000000;
          comp.data_.n = (Number)((long)"opcodeEntry->hasType" + 0xf);
          comp.data_._8_4_ = 5;
          rapidjson::
          GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
          ::AddMember<VkStructureType>(&value,(StringRefType *)&comp,create_info->sType,alloc);
          extent.data_.n = (Number)anon_var_dwarf_4155c;
          extent.data_._8_4_ = 0x17;
          rapidjson::
          GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
          ::AddMember<VkSampleCountFlagBits>
                    (&value,(StringRefType *)&extent,create_info->libraryCount,alloc);
          range.data_.n = (Number)0x0;
          range.data_.s.str = (Ch *)0x3000000000000;
          att.data_.n = (Number)((long)"Fwidth" + 1);
          att.data_._8_4_ = 5;
          rapidjson::
          GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
          ::AddMember<unsigned_int>
                    ((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                      *)&range,(StringRefType *)&att,*(uint *)&create_info->field_0x14,alloc);
          discardRectangles.data_.n = (Number)((long)"VK_AMD_negative_viewport_height" + 0x19);
          discardRectangles.data_._8_4_ = 6;
          rapidjson::
          GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
          ::AddMember<unsigned_int>
                    ((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                      *)&range,(StringRefType *)&discardRectangles,*(uint *)&create_info->pLibraries
                     ,alloc);
          combinerOps.data_.n = (Number)anon_var_dwarf_41568;
          combinerOps.data_._8_4_ = 0x16;
          rapidjson::
          GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
          ::AddMember(&value,(StringRefType *)&combinerOps,
                      (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                       *)&range,alloc);
          uVar4 = *(uint *)((long)&create_info->pLibraries + 4);
          if (uVar4 != 0) {
            range.data_.n = (Number)0x0;
            range.data_.s.str = (Ch *)0x4000000000000;
            for (uVar7 = 0; uVar7 < uVar4; uVar7 = uVar7 + 1) {
              loc.data_.n = (Number)0x0;
              loc.data_.s.str = (Ch *)0x3000000000000;
              local_b8.s = "x";
              local_b8.length = 1;
              rapidjson::
              GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              ::AddMember<float>(&loc,&local_b8,*(float *)(*(long *)(create_info + 1) + uVar7 * 8),
                                 alloc);
              local_98.s = "y";
              local_98.length = 1;
              rapidjson::
              GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              ::AddMember<float>(&loc,&local_98,
                                 *(float *)(*(long *)(create_info + 1) + 4 + uVar7 * 8),alloc);
              rapidjson::
              GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              ::PushBack((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                          *)&range,&loc,alloc);
              uVar4 = *(uint *)((long)&create_info->pLibraries + 4);
            }
            loc.data_.n = (Number)anon_var_dwarf_41574;
            loc.data_._8_4_ = 0xf;
            pSVar6 = (StringRefType *)&loc;
            goto LAB_0014a1d4;
          }
        }
        else if (VVar3 == VK_STRUCTURE_TYPE_PIPELINE_SAMPLE_LOCATIONS_STATE_CREATE_INFO_EXT) {
          value.data_.n = (Number)0x0;
          value.data_.s.str = (Ch *)0x3000000000000;
          comp.data_.n = (Number)((long)"opcodeEntry->hasType" + 0xf);
          comp.data_._8_4_ = 5;
          rapidjson::
          GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
          ::AddMember<VkStructureType>(&value,(StringRefType *)&comp,create_info->sType,alloc);
          extent.data_.n = (Number)anon_var_dwarf_41538;
          extent.data_._8_4_ = 0x15;
          rapidjson::
          GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
          ::AddMember<unsigned_int>(&value,(StringRefType *)&extent,create_info->libraryCount,alloc)
          ;
          if ((local_88 != (DynamicStateInfo *)0x0) &&
             (((local_88->sample_locations_enable != false || (create_info->libraryCount != 0)) &&
              (local_88->sample_locations == false)))) {
            range.data_.n = (Number)0x0;
            range.data_.s.str = (Ch *)0x3000000000000;
            att.data_.n = (Number)((long)"opcodeEntry->hasType" + 0xf);
            att.data_._8_4_ = 5;
            rapidjson::
            GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
            ::AddMember<VkStructureType>
                      ((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                        *)&range,(StringRefType *)&att,*(VkStructureType *)&create_info->pLibraries,
                       alloc);
            discardRectangles.data_.n = (Number)anon_var_dwarf_4155c;
            discardRectangles.data_._8_4_ = 0x17;
            rapidjson::
            GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
            ::AddMember<VkSampleCountFlagBits>
                      ((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                        *)&range,(StringRefType *)&discardRectangles,
                       *(VkSampleCountFlagBits *)&create_info[1].pNext,alloc);
            combinerOps.data_.n = (Number)0x0;
            combinerOps.data_.s.str = (Ch *)0x3000000000000;
            loc.data_.n = (Number)((long)"Fwidth" + 1);
            loc.data_._8_4_ = 5;
            rapidjson::
            GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
            ::AddMember<unsigned_int>
                      (&combinerOps,(StringRefType *)&loc,*(uint *)((long)&create_info[1].pNext + 4)
                       ,alloc);
            local_b8.s = "height";
            local_b8.length = 6;
            rapidjson::
            GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
            ::AddMember<unsigned_int>(&combinerOps,&local_b8,create_info[1].libraryCount,alloc);
            local_98.s = "sampleLocationGridSize";
            local_98.length = 0x16;
            rapidjson::
            GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
            ::AddMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                         *)&range,&local_98,&combinerOps,alloc);
            uVar4 = *(uint *)&create_info[1].field_0x14;
            if (uVar4 != 0) {
              combinerOps.data_.n = (Number)0x0;
              combinerOps.data_.s.str = (Ch *)0x4000000000000;
              for (uVar7 = 0; uVar7 < uVar4; uVar7 = uVar7 + 1) {
                loc_1.data_.n = (Number)0x0;
                loc_1.data_.s.str = (Ch *)0x3000000000000;
                local_60.s = "x";
                local_60.length = 1;
                rapidjson::
                GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                ::AddMember<float>(&loc_1,&local_60,*(float *)(create_info[1].pLibraries + uVar7),
                                   alloc);
                local_70.s = "y";
                local_70.length = 1;
                rapidjson::
                GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                ::AddMember<float>(&loc_1,&local_70,
                                   *(float *)((long)create_info[1].pLibraries + uVar7 * 8 + 4),alloc
                                  );
                rapidjson::
                GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                ::PushBack(&combinerOps,&loc_1,alloc);
                uVar4 = *(uint *)&create_info[1].field_0x14;
              }
              loc_1.data_.n = (Number)anon_var_dwarf_41574;
              loc_1.data_._8_4_ = 0xf;
              rapidjson::
              GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              ::AddMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                           *)&range,(StringRefType *)&loc_1,&combinerOps,alloc);
            }
            pSVar5 = (StringRefType *)&combinerOps;
            combinerOps.data_.n = (Number)anon_var_dwarf_41544;
            combinerOps.data_._8_4_ = 0x13;
            goto LAB_0014a28a;
          }
        }
        else if (VVar3 == VK_STRUCTURE_TYPE_PIPELINE_COLOR_BLEND_ADVANCED_STATE_CREATE_INFO_EXT) {
          value.data_.n = (Number)0x0;
          value.data_.s.str = (Ch *)0x3000000000000;
          comp.data_.n = (Number)((long)"opcodeEntry->hasType" + 0xf);
          comp.data_._8_4_ = 5;
          rapidjson::
          GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
          ::AddMember<VkStructureType>(&value,(StringRefType *)&comp,create_info->sType,alloc);
          extent.data_.n = (Number)anon_var_dwarf_41418;
          extent.data_._8_4_ = 0x10;
          rapidjson::
          GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
          ::AddMember<unsigned_int>(&value,(StringRefType *)&extent,create_info->libraryCount,alloc)
          ;
          range.data_.n = (Number)anon_var_dwarf_41424;
          range.data_._8_4_ = 0x10;
          rapidjson::
          GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
          ::AddMember<unsigned_int>
                    (&value,(StringRefType *)&range,*(uint *)&create_info->field_0x14,alloc);
          att.data_.n = (Number)anon_var_dwarf_4140c;
          att.data_._8_4_ = 0xc;
          rapidjson::
          GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
          ::AddMember<VkBlendOverlapEXT>
                    (&value,(StringRefType *)&att,*(VkBlendOverlapEXT *)&create_info->pLibraries,
                     alloc);
        }
        else {
          if (VVar3 == VK_STRUCTURE_TYPE_SAMPLER_YCBCR_CONVERSION_CREATE_INFO) {
            value.data_.n = (Number)0x0;
            value.data_.s.str = (Ch *)0x3000000000000;
            comp.data_.n = (Number)0x0;
            comp.data_.s.str = (Ch *)0x4000000000000;
            extent.data_.n = (Number)((long)"opcodeEntry->hasType" + 0xf);
            extent.data_._8_4_ = 5;
            rapidjson::
            GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
            ::AddMember<VkStructureType>(&value,(StringRefType *)&extent,create_info->sType,alloc);
            range.data_.n = (Number)((long)"Unsupported format" + 0xc);
            range.data_._8_4_ = 6;
            rapidjson::
            GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
            ::AddMember<VkFormat>(&value,(StringRefType *)&range,create_info->libraryCount,alloc);
            att.data_.n = (Number)anon_var_dwarf_41634;
            att.data_._8_4_ = 10;
            rapidjson::
            GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
            ::AddMember<VkSamplerYcbcrModelConversion>
                      (&value,(StringRefType *)&att,
                       *(VkSamplerYcbcrModelConversion *)&create_info->field_0x14,alloc);
            discardRectangles.data_.n = (Number)anon_var_dwarf_41640;
            discardRectangles.data_._8_4_ = 10;
            rapidjson::
            GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
            ::AddMember<VkSamplerYcbcrRange>
                      (&value,(StringRefType *)&discardRectangles,
                       *(VkSamplerYcbcrRange *)&create_info->pLibraries,alloc);
            rapidjson::
            GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
            ::PushBack<VkComponentSwizzle>
                      (&comp,*(VkComponentSwizzle *)((long)&create_info->pLibraries + 4),alloc);
            rapidjson::
            GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
            ::PushBack<VkComponentSwizzle>(&comp,create_info[1].sType,alloc);
            rapidjson::
            GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
            ::PushBack<VkComponentSwizzle>
                      (&comp,*(VkComponentSwizzle *)&create_info[1].field_0x4,alloc);
            rapidjson::
            GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
            ::PushBack<VkComponentSwizzle>(&comp,*(VkComponentSwizzle *)&create_info[1].pNext,alloc)
            ;
            combinerOps.data_.n = (Number)((long)"Expected Result Type to have 2 components" + 0x1f)
            ;
            combinerOps.data_._8_4_ = 10;
            rapidjson::
            GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
            ::AddMember(&value,(StringRefType *)&combinerOps,&comp,alloc);
            loc.data_.n = (Number)anon_var_dwarf_41658;
            loc.data_._8_4_ = 0xd;
            rapidjson::
            GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
            ::AddMember<VkChromaLocation>
                      (&value,(StringRefType *)&loc,
                       *(VkChromaLocation *)((long)&create_info[1].pNext + 4),alloc);
            local_b8.s = "yChromaOffset";
            local_b8.length = 0xd;
            rapidjson::
            GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
            ::AddMember<VkChromaLocation>(&value,&local_b8,create_info[1].libraryCount,alloc);
            local_98.s = "chromaFilter";
            local_98.length = 0xc;
            rapidjson::
            GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
            ::AddMember<VkFilter>(&value,&local_98,*(VkFilter *)&create_info[1].field_0x14,alloc);
            loc_1.data_.n = (Number)anon_var_dwarf_4167c;
            loc_1.data_._8_4_ = 0x1b;
            uVar4 = *(uint *)&create_info[1].pLibraries;
            pSVar6 = (StringRefType *)&loc_1;
            goto LAB_0014a010;
          }
          if (VVar3 == VK_STRUCTURE_TYPE_DESCRIPTOR_SET_LAYOUT_BINDING_FLAGS_CREATE_INFO) {
            value.data_.n = (Number)0x0;
            value.data_.s.str = (Ch *)0x3000000000000;
            comp.data_.n = (Number)((long)"opcodeEntry->hasType" + 0xf);
            comp.data_._8_4_ = 5;
            rapidjson::
            GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
            ::AddMember<VkStructureType>(&value,(StringRefType *)&comp,create_info->sType,alloc);
            uVar4 = create_info->libraryCount;
            if (uVar4 != 0) {
              extent.data_.n = (Number)0x0;
              extent.data_.s.str = (Ch *)0x4000000000000;
              for (uVar7 = 0; uVar7 < uVar4; uVar7 = uVar7 + 1) {
                rapidjson::
                GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                ::PushBack<unsigned_int>
                          (&extent,*(uint *)((long)create_info->pLibraries + uVar7 * 4),alloc);
                uVar4 = create_info->libraryCount;
              }
              range.data_.n = (Number)anon_var_dwarf_41400;
              range.data_._8_4_ = 0xc;
              goto LAB_0014a1cf;
            }
          }
          else if (VVar3 == VK_STRUCTURE_TYPE_PIPELINE_VERTEX_INPUT_DIVISOR_STATE_CREATE_INFO) {
            value.data_.n = (Number)0x0;
            value.data_.s.str = (Ch *)0x3000000000000;
            comp.data_.n = (Number)((long)"opcodeEntry->hasType" + 0xf);
            comp.data_._8_4_ = 5;
            rapidjson::
            GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
            ::AddMember<VkStructureType>(&value,(StringRefType *)&comp,create_info->sType,alloc);
            extent.data_.n = (Number)anon_var_dwarf_413c4;
            extent.data_._8_4_ = 0x19;
            rapidjson::
            GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
            ::AddMember<unsigned_int>
                      (&value,(StringRefType *)&extent,create_info->libraryCount,alloc);
            if (create_info->pLibraries != (VkPipeline *)0x0) {
              range.data_.n = (Number)0x0;
              range.data_.s.str = (Ch *)0x4000000000000;
              for (uVar7 = 0; uVar7 < create_info->libraryCount; uVar7 = uVar7 + 1) {
                att.data_.n = (Number)0x0;
                att.data_.s.str = (Ch *)0x3000000000000;
                discardRectangles.data_.n = (Number)anon_var_dwarf_40baf;
                discardRectangles.data_._8_4_ = 7;
                rapidjson::
                GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                ::AddMember<unsigned_int>
                          (&att,(StringRefType *)&discardRectangles,
                           *(uint *)(create_info->pLibraries + uVar7),alloc);
                combinerOps.data_.n = (Number)((long)"VK_KHR_vertex_attribute_divisor" + 0x18);
                combinerOps.data_._8_4_ = 7;
                rapidjson::
                GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                ::AddMember<unsigned_int>
                          (&att,(StringRefType *)&combinerOps,
                           *(uint *)((long)create_info->pLibraries + uVar7 * 8 + 4),alloc);
                rapidjson::
                GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                ::PushBack((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                            *)&range,&att,alloc);
              }
              att.data_.n = (Number)anon_var_dwarf_413d0;
              att.data_._8_4_ = 0x15;
              pSVar6 = (StringRefType *)&att;
              goto LAB_0014a1d4;
            }
          }
          else if (VVar3 == VK_STRUCTURE_TYPE_SUBPASS_DESCRIPTION_DEPTH_STENCIL_RESOLVE) {
            value.data_.n = (Number)0x0;
            value.data_.s.str = (Ch *)0x3000000000000;
            comp.data_.n = (Number)((long)"opcodeEntry->hasType" + 0xf);
            comp.data_._8_4_ = 5;
            rapidjson::
            GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
            ::AddMember<VkStructureType>(&value,(StringRefType *)&comp,create_info->sType,alloc);
            extent.data_.n = (Number)anon_var_dwarf_414c0;
            extent.data_._8_4_ = 0x10;
            rapidjson::
            GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
            ::AddMember<VkResolveModeFlagBits>
                      (&value,(StringRefType *)&extent,create_info->libraryCount,alloc);
            range.data_.n = (Number)anon_var_dwarf_414cc;
            range.data_._8_4_ = 0x12;
            rapidjson::
            GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
            ::AddMember<VkResolveModeFlagBits>
                      (&value,(StringRefType *)&range,
                       *(VkResolveModeFlagBits *)&create_info->field_0x14,alloc);
            if ((VkAttachmentReference2 *)create_info->pLibraries != (VkAttachmentReference2 *)0x0)
            {
              att.data_.n = (Number)0x0;
              att.data_.s.str = (Ch *)0x0;
              bVar2 = json_value<rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                                ((VkAttachmentReference2 *)create_info->pLibraries,alloc,&att);
              if (bVar2) {
                discardRectangles.data_.n = (Number)anon_var_dwarf_414d8;
                discardRectangles.data_._8_4_ = 0x1d;
                pSVar5 = (StringRefType *)&discardRectangles;
                pSVar6 = (StringRefType *)&att;
                goto LAB_0014a28a;
              }
              goto LAB_0014a32b;
            }
          }
          else {
            if (VVar3 == VK_STRUCTURE_TYPE_RENDER_PASS_FRAGMENT_DENSITY_MAP_CREATE_INFO_EXT) {
              value.data_.n = (Number)0x0;
              value.data_.s.str = (Ch *)0x3000000000000;
              comp.data_.n = (Number)((long)"opcodeEntry->hasType" + 0xf);
              comp.data_._8_4_ = 5;
              rapidjson::
              GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              ::AddMember<VkStructureType>(&value,(StringRefType *)&comp,create_info->sType,alloc);
              extent.data_.n = (Number)0x0;
              extent.data_.s.str = (Ch *)0x3000000000000;
              range.data_.n = (Number)anon_var_dwarf_41724;
              range.data_._8_4_ = 10;
              pSVar6 = (StringRefType *)&extent;
              rapidjson::
              GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              ::AddMember<unsigned_int>
                        ((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                          *)pSVar6,(StringRefType *)&range,create_info->libraryCount,alloc);
              att.data_.n = (Number)((long)"Pipeline layout" + 9);
              att.data_._8_4_ = 6;
              rapidjson::
              GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              ::AddMember<VkImageLayout>
                        ((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                          *)pSVar6,(StringRefType *)&att,*(VkImageLayout *)&create_info->field_0x14,
                         alloc);
              discardRectangles.data_.n = (Number)anon_var_dwarf_41718;
              discardRectangles.data_._8_4_ = 0x1c;
              pSVar5 = (StringRefType *)&discardRectangles;
LAB_0014a217:
              rapidjson::
              GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              ::AddMember(&value,pSVar5,
                          (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                           *)pSVar6,alloc);
              goto LAB_0014a21f;
            }
            if (VVar3 == VK_STRUCTURE_TYPE_PIPELINE_SHADER_STAGE_REQUIRED_SUBGROUP_SIZE_CREATE_INFO)
            {
              value.data_.n = (Number)0x0;
              value.data_.s.str = (Ch *)0x3000000000000;
              comp.data_.n = (Number)((long)"opcodeEntry->hasType" + 0xf);
              comp.data_._8_4_ = 5;
              rapidjson::
              GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              ::AddMember<VkStructureType>(&value,(StringRefType *)&comp,create_info->sType,alloc);
              extent.data_.n = (Number)anon_var_dwarf_41490;
              extent.data_._8_4_ = 0x14;
              goto LAB_00148d3a;
            }
            if (VVar3 == VK_STRUCTURE_TYPE_FRAGMENT_SHADING_RATE_ATTACHMENT_INFO_KHR) {
              value.data_.n = (Number)0x0;
              value.data_.s.str = (Ch *)0x3000000000000;
              comp.data_.n = (Number)((long)"opcodeEntry->hasType" + 0xf);
              comp.data_._8_4_ = 5;
              rapidjson::
              GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              ::AddMember<VkStructureType>(&value,(StringRefType *)&comp,create_info->sType,alloc);
              extent.data_.n = (Number)0x0;
              extent.data_.s.str = (Ch *)0x3000000000000;
              range.data_.n = (Number)((long)"Fwidth" + 1);
              range.data_._8_4_ = 5;
              rapidjson::
              GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              ::AddMember<unsigned_int>
                        (&extent,(StringRefType *)&range,*(uint *)&create_info->pLibraries,alloc);
              att.data_.n = (Number)((long)"VK_AMD_negative_viewport_height" + 0x19);
              att.data_._8_4_ = 6;
              rapidjson::
              GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              ::AddMember<unsigned_int>
                        (&extent,(StringRefType *)&att,*(uint *)((long)&create_info->pLibraries + 4)
                         ,alloc);
              discardRectangles.data_.n = (Number)anon_var_dwarf_414e4;
              discardRectangles.data_._8_4_ = 0x1e;
              rapidjson::
              GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              ::AddMember(&value,(StringRefType *)&discardRectangles,&extent,alloc);
              if (*(VkAttachmentReference2 **)&create_info->libraryCount !=
                  (VkAttachmentReference2 *)0x0) {
                combinerOps.data_.n = (Number)0x0;
                combinerOps.data_.s.str = (Ch *)0x0;
                bVar2 = json_value<rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                                  (*(VkAttachmentReference2 **)&create_info->libraryCount,alloc,
                                   &combinerOps);
                if (!bVar2) goto LAB_0014a32b;
                loc.data_.n = (Number)anon_var_dwarf_414f0;
                loc.data_._8_4_ = 0x1d;
                pSVar5 = (StringRefType *)&loc;
                pSVar6 = (StringRefType *)&combinerOps;
LAB_0014a28a:
                rapidjson::
                GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                ::AddMember(&value,pSVar5,
                            (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                             *)pSVar6,alloc);
              }
            }
            else {
              if (VVar3 == VK_STRUCTURE_TYPE_PIPELINE_FRAGMENT_SHADING_RATE_STATE_CREATE_INFO_KHR) {
                value.data_.n = (Number)0x0;
                value.data_.s.str = (Ch *)0x3000000000000;
                comp.data_.n = (Number)((long)"opcodeEntry->hasType" + 0xf);
                comp.data_._8_4_ = 5;
                rapidjson::
                GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                ::AddMember<VkStructureType>(&value,(StringRefType *)&comp,create_info->sType,alloc)
                ;
                if ((local_88 == (DynamicStateInfo *)0x0) ||
                   (local_88->fragment_shading_rate != false)) goto LAB_0014a21f;
                extent.data_.n = (Number)0x0;
                extent.data_.s.str = (Ch *)0x3000000000000;
                range.data_.n = (Number)((long)"Fwidth" + 1);
                range.data_._8_4_ = 5;
                rapidjson::
                GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                ::AddMember<unsigned_int>
                          (&extent,(StringRefType *)&range,create_info->libraryCount,alloc);
                att.data_.n = (Number)((long)"VK_AMD_negative_viewport_height" + 0x19);
                att.data_._8_4_ = 6;
                rapidjson::
                GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                ::AddMember<unsigned_int>
                          (&extent,(StringRefType *)&att,*(uint *)&create_info->field_0x14,alloc);
                discardRectangles.data_.n = (Number)anon_var_dwarf_4161c;
                discardRectangles.data_._8_4_ = 0xc;
                rapidjson::
                GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                ::AddMember(&value,(StringRefType *)&discardRectangles,&extent,alloc);
                combinerOps.data_.n = (Number)0x0;
                combinerOps.data_.s.str = (Ch *)0x4000000000000;
                pSVar6 = (StringRefType *)&combinerOps;
                for (lVar8 = 0; lVar8 != 2; lVar8 = lVar8 + 1) {
                  rapidjson::
                  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                  ::PushBack<VkFragmentShadingRateCombinerOpKHR>
                            ((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                              *)pSVar6,
                             *(VkFragmentShadingRateCombinerOpKHR *)
                              ((long)&create_info->pLibraries + lVar8 * 4),alloc);
                }
                loc.data_.n = (Number)anon_var_dwarf_41628;
                loc.data_._8_4_ = 0xb;
                pSVar5 = (StringRefType *)&loc;
                goto LAB_0014a217;
              }
              if (VVar3 == VK_STRUCTURE_TYPE_RENDERING_ATTACHMENT_LOCATION_INFO) {
                value.data_.n = (Number)0x0;
                value.data_.s.str = (Ch *)0x3000000000000;
                comp.data_.n = (Number)((long)"opcodeEntry->hasType" + 0xf);
                comp.data_._8_4_ = 5;
                rapidjson::
                GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                ::AddMember<VkStructureType>(&value,(StringRefType *)&comp,create_info->sType,alloc)
                ;
                extent.data_.n = (Number)anon_var_dwarf_41790;
                extent.data_._8_4_ = 0x14;
                rapidjson::
                GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                ::AddMember<unsigned_int>
                          (&value,(StringRefType *)&extent,create_info->libraryCount,alloc);
                if (create_info->pLibraries != (VkPipeline *)0x0) {
                  range.data_.n = (Number)0x0;
                  range.data_.s.str = (Ch *)0x4000000000000;
                  for (uVar7 = 0; uVar7 < create_info->libraryCount; uVar7 = uVar7 + 1) {
                    rapidjson::
                    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                    ::PushBack<unsigned_int>
                              ((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                                *)&range,*(uint *)((long)create_info->pLibraries + uVar7 * 4),alloc)
                    ;
                  }
                  att.data_.n = (Number)anon_var_dwarf_4179c;
                  att.data_._8_4_ = 0x18;
LAB_0014a27c:
                  pSVar5 = (StringRefType *)&att;
                  goto LAB_0014a28a;
                }
                goto LAB_0014a292;
              }
              if (VVar3 != VK_STRUCTURE_TYPE_RENDERING_INPUT_ATTACHMENT_INDEX_INFO) {
                if (VVar3 == VK_STRUCTURE_TYPE_ATTACHMENT_REFERENCE_STENCIL_LAYOUT) {
                  value.data_.n = (Number)0x0;
                  value.data_.s.str = (Ch *)0x3000000000000;
                  comp.data_.n = (Number)((long)"opcodeEntry->hasType" + 0xf);
                  comp.data_._8_4_ = 5;
                  rapidjson::
                  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                  ::AddMember<VkStructureType>
                            (&value,(StringRefType *)&comp,create_info->sType,alloc);
                  extent.data_.n = (Number)anon_var_dwarf_414b4;
                  extent.data_._8_4_ = 0xd;
                  value_01 = create_info->libraryCount;
                  pSVar6 = (StringRefType *)&extent;
LAB_001499af:
                  rapidjson::
                  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                  ::AddMember<VkImageLayout>(&value,pSVar6,value_01,alloc);
                  goto LAB_0014a21f;
                }
                if (VVar3 == VK_STRUCTURE_TYPE_ATTACHMENT_DESCRIPTION_STENCIL_LAYOUT) {
                  value.data_.n = (Number)0x0;
                  value.data_.s.str = (Ch *)0x3000000000000;
                  comp.data_.n = (Number)((long)"opcodeEntry->hasType" + 0xf);
                  comp.data_._8_4_ = 5;
                  rapidjson::
                  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                  ::AddMember<VkStructureType>
                            (&value,(StringRefType *)&comp,create_info->sType,alloc);
                  extent.data_.n = (Number)anon_var_dwarf_4149c;
                  extent.data_._8_4_ = 0x14;
                  rapidjson::
                  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                  ::AddMember<VkImageLayout>
                            (&value,(StringRefType *)&extent,create_info->libraryCount,alloc);
                  range.data_.n = (Number)anon_var_dwarf_414a8;
                  range.data_._8_4_ = 0x12;
                  value_01 = *(VkImageLayout *)&create_info->field_0x14;
                  goto LAB_001499af;
                }
                if (VVar3 == 
                    VK_STRUCTURE_TYPE_PIPELINE_RASTERIZATION_PROVOKING_VERTEX_STATE_CREATE_INFO_EXT)
                {
                  value.data_.n = (Number)0x0;
                  value.data_.s.str = (Ch *)0x3000000000000;
                  comp.data_.n = (Number)((long)"opcodeEntry->hasType" + 0xf);
                  comp.data_._8_4_ = 5;
                  rapidjson::
                  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                  ::AddMember<VkStructureType>
                            (&value,(StringRefType *)&comp,create_info->sType,alloc);
                  extent.data_.n = (Number)anon_var_dwarf_41580;
                  extent.data_._8_4_ = 0x13;
                  rapidjson::
                  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                  ::AddMember<VkProvokingVertexModeEXT>
                            (&value,(StringRefType *)&extent,create_info->libraryCount,alloc);
LAB_0014a21f:
                  next.data_.n = value.data_.n;
                  next.data_.s.str = value.data_.s.str;
                  goto LAB_0014a29b;
                }
                if (VVar3 == VK_STRUCTURE_TYPE_PIPELINE_RASTERIZATION_LINE_STATE_CREATE_INFO) {
                  value.data_.n = (Number)0x0;
                  value.data_.s.str = (Ch *)0x3000000000000;
                  comp.data_.n = (Number)((long)"opcodeEntry->hasType" + 0xf);
                  comp.data_._8_4_ = 5;
                  rapidjson::
                  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                  ::AddMember<VkStructureType>
                            (&value,(StringRefType *)&comp,create_info->sType,alloc);
                  extent.data_.n = (Number)anon_var_dwarf_41460;
                  extent.data_._8_4_ = 0x15;
                  rapidjson::
                  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                  ::AddMember<VkLineRasterizationMode>
                            (&value,(StringRefType *)&extent,create_info->libraryCount,alloc);
                  range.data_.n = (Number)anon_var_dwarf_4146c;
                  range.data_._8_4_ = 0x12;
                  rapidjson::
                  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                  ::AddMember<unsigned_int>
                            (&value,(StringRefType *)&range,*(uint *)&create_info->field_0x14,alloc)
                  ;
                  att.data_.n = (Number)anon_var_dwarf_41478;
                  att.data_._8_4_ = 0x11;
                  rapidjson::
                  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                  ::AddMember<unsigned_int>
                            (&value,(StringRefType *)&att,*(uint *)&create_info->pLibraries,alloc);
                  discardRectangles.data_.n = (Number)anon_var_dwarf_41484;
                  discardRectangles.data_._8_4_ = 0x12;
                  rapidjson::
                  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                  ::AddMember<unsigned_short>
                            (&value,(StringRefType *)&discardRectangles,
                             *(unsigned_short *)((long)&create_info->pLibraries + 4),alloc);
                  goto LAB_0014a21f;
                }
                if (VVar3 == VK_STRUCTURE_TYPE_DEPTH_BIAS_REPRESENTATION_INFO_EXT) {
                  value.data_.n = (Number)0x0;
                  value.data_.s.str = (Ch *)0x3000000000000;
                  comp.data_.n = (Number)((long)"opcodeEntry->hasType" + 0xf);
                  comp.data_._8_4_ = 5;
                  rapidjson::
                  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                  ::AddMember<VkStructureType>
                            (&value,(StringRefType *)&comp,create_info->sType,alloc);
                  extent.data_.n = (Number)anon_var_dwarf_4170c;
                  extent.data_._8_4_ = 0x17;
                  rapidjson::
                  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                  ::AddMember<VkDepthBiasRepresentationEXT>
                            (&value,(StringRefType *)&extent,create_info->libraryCount,alloc);
                  range.data_.n = (Number)anon_var_dwarf_41700;
                  range.data_._8_4_ = 0xe;
                  value_00 = *(uint32_t *)&create_info->field_0x14;
                  goto LAB_001492fd;
                }
                if (VVar3 == VK_STRUCTURE_TYPE_SAMPLER_CUSTOM_BORDER_COLOR_CREATE_INFO_EXT) {
                  value.data_.n = (Number)0x0;
                  value.data_.s.str = (Ch *)0x3000000000000;
                  comp.data_.n = (Number)((long)"opcodeEntry->hasType" + 0xf);
                  comp.data_._8_4_ = 5;
                  rapidjson::
                  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                  ::AddMember<VkStructureType>
                            (&value,(StringRefType *)&comp,create_info->sType,alloc);
                  extent.data_.n = (Number)0x0;
                  extent.data_.s.str = (Ch *)0x4000000000000;
                  for (lVar8 = 0; lVar8 != 4; lVar8 = lVar8 + 1) {
                    rapidjson::
                    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                    ::PushBack<unsigned_int>(&extent,(&create_info->libraryCount)[lVar8],alloc);
                  }
                  range.data_.n = (Number)anon_var_dwarf_4158c;
                  range.data_._8_4_ = 0x11;
                  rapidjson::
                  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                  ::AddMember(&value,(StringRefType *)&range,&extent,alloc);
                  att.data_.n = (Number)((long)"Unsupported format" + 0xc);
                  att.data_._8_4_ = 6;
                  rapidjson::
                  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                  ::AddMember<VkFormat>(&value,(StringRefType *)&att,create_info[1].sType,alloc);
                  goto LAB_0014a292;
                }
                if (VVar3 == VK_STRUCTURE_TYPE_PIPELINE_LIBRARY_CREATE_INFO_KHR) {
                  bVar2 = json_value<rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                                    (create_info,alloc,true,&next);
                  if (bVar2) goto LAB_0014a29b;
                  goto LAB_0014a32b;
                }
                if (VVar3 == VK_STRUCTURE_TYPE_MEMORY_BARRIER_2) {
                  value.data_.n = (Number)0x0;
                  value.data_.s.str = (Ch *)0x3000000000000;
                  comp.data_.n = (Number)((long)"opcodeEntry->hasType" + 0xf);
                  comp.data_._8_4_ = 5;
                  rapidjson::
                  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                  ::AddMember<VkStructureType>
                            (&value,(StringRefType *)&comp,create_info->sType,alloc);
                  extent.data_.n = (Number)anon_var_dwarf_415e0;
                  extent.data_._8_4_ = 0xc;
                  rapidjson::
                  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                  ::AddMember<unsigned_long>
                            (&value,(StringRefType *)&extent,
                             *(unsigned_long *)&create_info->libraryCount,alloc);
                  range.data_.n = (Number)anon_var_dwarf_415ec;
                  range.data_._8_4_ = 0xd;
                  rapidjson::
                  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                  ::AddMember<unsigned_long>
                            (&value,(StringRefType *)&range,(unsigned_long)create_info->pLibraries,
                             alloc);
                  att.data_.n = (Number)anon_var_dwarf_415f8;
                  att.data_._8_4_ = 0xc;
                  rapidjson::
                  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                  ::AddMember<unsigned_long>
                            (&value,(StringRefType *)&att,*(unsigned_long *)(create_info + 1),alloc)
                  ;
                  discardRectangles.data_.n = (Number)anon_var_dwarf_41604;
                  discardRectangles.data_._8_4_ = 0xd;
                  rapidjson::
                  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                  ::AddMember<unsigned_long>
                            (&value,(StringRefType *)&discardRectangles,
                             (unsigned_long)create_info[1].pNext,alloc);
                  goto LAB_0014a21f;
                }
                if (VVar3 == VK_STRUCTURE_TYPE_GRAPHICS_PIPELINE_LIBRARY_CREATE_INFO_EXT) {
                  value.data_.n = (Number)0x0;
                  value.data_.s.str = (Ch *)0x3000000000000;
                  comp.data_.n = (Number)((long)"opcodeEntry->hasType" + 0xf);
                  comp.data_._8_4_ = 5;
                  rapidjson::
                  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                  ::AddMember<VkStructureType>
                            (&value,(StringRefType *)&comp,create_info->sType,alloc);
                  extent.data_.n = (Number)((long)"kernel enqeue flags" + 0xe);
                  extent.data_._8_4_ = 5;
                }
                else {
                  if (VVar3 == VK_STRUCTURE_TYPE_MUTABLE_DESCRIPTOR_TYPE_CREATE_INFO_EXT) {
                    value.data_.n = (Number)0x0;
                    value.data_.s.str = (Ch *)0x3000000000000;
                    comp.data_.n = (Number)((long)"opcodeEntry->hasType" + 0xf);
                    comp.data_._8_4_ = 5;
                    rapidjson::
                    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                    ::AddMember<VkStructureType>
                              (&value,(StringRefType *)&comp,create_info->sType,alloc);
                    extent.data_.n = (Number)0x0;
                    extent.data_.s.str = (Ch *)0x4000000000000;
                    for (uVar7 = 0; uVar7 < create_info->libraryCount; uVar7 = uVar7 + 1) {
                      range.data_.n = (Number)0x0;
                      range.data_.s.str = (Ch *)0x4000000000000;
                      ppVVar1 = create_info->pLibraries;
                      for (uVar9 = 0; uVar9 < *(uint *)(ppVVar1 + uVar7 * 2); uVar9 = uVar9 + 1) {
                        rapidjson::
                        GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                        ::PushBack<VkDescriptorType>
                                  ((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                                    *)&range,
                                   *(VkDescriptorType *)((ppVVar1 + uVar7 * 2)[1] + uVar9 * 4),alloc
                                  );
                      }
                      rapidjson::
                      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                      ::PushBack(&extent,(GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                                          *)&range,alloc);
                    }
                    range.data_.n = (Number)anon_var_dwarf_417d8;
                    range.data_._8_4_ = 0x1a;
                    goto LAB_00149f62;
                  }
                  if (VVar3 == 
                      VK_STRUCTURE_TYPE_PIPELINE_VIEWPORT_DEPTH_CLIP_CONTROL_CREATE_INFO_EXT) {
                    value.data_.n = (Number)0x0;
                    value.data_.s.str = (Ch *)0x3000000000000;
                    comp.data_.n = (Number)((long)"opcodeEntry->hasType" + 0xf);
                    comp.data_._8_4_ = 5;
                    rapidjson::
                    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                    ::AddMember<VkStructureType>
                              (&value,(StringRefType *)&comp,create_info->sType,alloc);
                    extent.data_.n = (Number)anon_var_dwarf_41694;
                    extent.data_._8_4_ = 0x10;
                  }
                  else {
                    if (VVar3 == VK_STRUCTURE_TYPE_MULTISAMPLED_RENDER_TO_SINGLE_SAMPLED_INFO_EXT) {
                      value.data_.n = (Number)0x0;
                      value.data_.s.str = (Ch *)0x3000000000000;
                      comp.data_.n = (Number)((long)"opcodeEntry->hasType" + 0xf);
                      comp.data_._8_4_ = 5;
                      rapidjson::
                      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                      ::AddMember<VkStructureType>
                                (&value,(StringRefType *)&comp,create_info->sType,alloc);
                      extent.data_.n = (Number)anon_var_dwarf_411d4;
                      extent.data_._8_4_ = 0x14;
                      rapidjson::
                      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                      ::AddMember<VkSampleCountFlagBits>
                                (&value,(StringRefType *)&extent,
                                 *(VkSampleCountFlagBits *)&create_info->field_0x14,alloc);
                      range.data_.n = (Number)anon_var_dwarf_416e8;
                      range.data_._8_4_ = 0x27;
                      value_00 = create_info->libraryCount;
                      goto LAB_001492fd;
                    }
                    if (VVar3 == VK_STRUCTURE_TYPE_PIPELINE_COLOR_WRITE_CREATE_INFO_EXT) {
                      value.data_.n = (Number)0x0;
                      value.data_.s.str = (Ch *)0x3000000000000;
                      comp.data_.n = (Number)((long)"opcodeEntry->hasType" + 0xf);
                      comp.data_._8_4_ = 5;
                      rapidjson::
                      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                      ::AddMember<VkStructureType>
                                (&value,(StringRefType *)&comp,create_info->sType,alloc);
                      extent.data_.n = (Number)anon_var_dwarf_41520;
                      extent.data_._8_4_ = 0xf;
                      rapidjson::
                      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                      ::AddMember<unsigned_int>
                                (&value,(StringRefType *)&extent,create_info->libraryCount,alloc);
                      if (local_88 != (DynamicStateInfo *)0x0) {
                        if ((create_info->pLibraries != (VkPipeline *)0x0) &&
                           (local_88->color_write_enable == false)) {
                          range.data_.n = (Number)0x0;
                          range.data_.s.str = (Ch *)0x4000000000000;
                          for (uVar7 = 0; uVar7 < create_info->libraryCount; uVar7 = uVar7 + 1) {
                            rapidjson::
                            GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                            ::PushBack<unsigned_int>
                                      ((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                                        *)&range,
                                       *(uint *)((long)create_info->pLibraries + uVar7 * 4),alloc);
                          }
                          att.data_.n = (Number)anon_var_dwarf_4152c;
                          att.data_._8_4_ = 0x11;
                          goto LAB_0014a27c;
                        }
                        goto LAB_0014a21f;
                      }
                      goto LAB_0014a32b;
                    }
                    if (VVar3 == 
                        VK_STRUCTURE_TYPE_SAMPLER_BORDER_COLOR_COMPONENT_MAPPING_CREATE_INFO_EXT) {
                      value.data_.n = (Number)0x0;
                      value.data_.s.str = (Ch *)0x3000000000000;
                      comp.data_.n = (Number)((long)"opcodeEntry->hasType" + 0xf);
                      comp.data_._8_4_ = 5;
                      rapidjson::
                      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                      ::AddMember<VkStructureType>
                                (&value,(StringRefType *)&comp,create_info->sType,alloc);
                      extent.data_.n = (Number)anon_var_dwarf_416ac;
                      extent.data_._8_4_ = 4;
                      rapidjson::
                      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                      ::AddMember<unsigned_int>
                                (&value,(StringRefType *)&extent,create_info[1].sType,alloc);
                      range.data_.n = (Number)0x0;
                      range.data_.s.str = (Ch *)0x3000000000000;
                      att.data_.n = (Number)((long)".r" + 1);
                      att.data_._8_4_ = 1;
                      rapidjson::
                      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                      ::AddMember<VkComponentSwizzle>
                                ((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                                  *)&range,(StringRefType *)&att,create_info->libraryCount,alloc);
                      discardRectangles.data_.n = (Number)((long)"%.32g" + 4);
                      discardRectangles.data_._8_4_ = 1;
                      rapidjson::
                      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                      ::AddMember<VkComponentSwizzle>
                                ((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                                  *)&range,(StringRefType *)&discardRectangles,
                                 *(VkComponentSwizzle *)&create_info->field_0x14,alloc);
                      combinerOps.data_.n = (Number)((long)" : register(b" + 0xc);
                      combinerOps.data_._8_4_ = 1;
                      rapidjson::
                      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                      ::AddMember<VkComponentSwizzle>
                                ((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                                  *)&range,(StringRefType *)&combinerOps,
                                 *(VkComponentSwizzle *)&create_info->pLibraries,alloc);
                      loc.data_.n = (Number)((long)"rgba" + 3);
                      loc.data_._8_4_ = 1;
                      rapidjson::
                      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                      ::AddMember<VkComponentSwizzle>
                                ((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                                  *)&range,(StringRefType *)&loc,
                                 *(VkComponentSwizzle *)((long)&create_info->pLibraries + 4),alloc);
                      local_b8.s = "components";
                      local_b8.length = 10;
                      pSVar5 = &local_b8;
                      pSVar6 = (StringRefType *)&range;
                      goto LAB_0014a217;
                    }
                    if (VVar3 != VK_STRUCTURE_TYPE_RENDER_PASS_CREATION_CONTROL_EXT) {
                      if (VVar3 == 
                          VK_STRUCTURE_TYPE_PIPELINE_SHADER_STAGE_MODULE_IDENTIFIER_CREATE_INFO_EXT)
                      goto LAB_0014a2ab;
                      if (VVar3 == VK_STRUCTURE_TYPE_PIPELINE_CREATE_FLAGS_2_CREATE_INFO) {
                        value.data_.n = (Number)0x0;
                        value.data_.s.str = (Ch *)0x3000000000000;
                        comp.data_.n = (Number)((long)"opcodeEntry->hasType" + 0xf);
                        comp.data_._8_4_ = 5;
                        rapidjson::
                        GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                        ::AddMember<VkStructureType>
                                  (&value,(StringRefType *)&comp,create_info->sType,alloc);
                        extent.data_.n = (Number)((long)"kernel enqeue flags" + 0xe);
                        extent.data_._8_4_ = 5;
                        rapidjson::
                        GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                        ::AddMember<unsigned_long>
                                  (&value,(StringRefType *)&extent,
                                   *(unsigned_long *)&create_info->libraryCount,alloc);
                        goto LAB_0014a292;
                      }
                      if (VVar3 != 
                          VK_STRUCTURE_TYPE_PIPELINE_TESSELLATION_DOMAIN_ORIGIN_STATE_CREATE_INFO) {
                        std::__cxx11::string::string
                                  ((string *)&local_50,"Unsupported pNext found, cannot hash sType."
                                   ,(allocator *)&value);
                        log_error_pnext_chain(&local_50,create_info);
                        std::__cxx11::string::_M_dispose();
                        goto LAB_0014a32b;
                      }
                      value.data_.n = (Number)0x0;
                      value.data_.s.str = (Ch *)0x3000000000000;
                      comp.data_.n = (Number)((long)"opcodeEntry->hasType" + 0xf);
                      comp.data_._8_4_ = 5;
                      rapidjson::
                      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                      ::AddMember<VkStructureType>
                                (&value,(StringRefType *)&comp,create_info->sType,alloc);
                      extent.data_.n = (Number)anon_var_dwarf_413b8;
                      extent.data_._8_4_ = 0xc;
                      rapidjson::
                      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                      ::AddMember<VkTessellationDomainOrigin>
                                (&value,(StringRefType *)&extent,create_info->libraryCount,alloc);
                      goto LAB_0014a292;
                    }
                    value.data_.n = (Number)0x0;
                    value.data_.s.str = (Ch *)0x3000000000000;
                    comp.data_.n = (Number)((long)"opcodeEntry->hasType" + 0xf);
                    comp.data_._8_4_ = 5;
                    rapidjson::
                    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                    ::AddMember<VkStructureType>
                              (&value,(StringRefType *)&comp,create_info->sType,alloc);
                    extent.data_.n = (Number)anon_var_dwarf_416a0;
                    extent.data_._8_4_ = 0xf;
                  }
                }
LAB_00148d3a:
                value_00 = create_info->libraryCount;
                pSVar6 = (StringRefType *)&extent;
LAB_001492fd:
                rapidjson::
                GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                ::AddMember<unsigned_int>(&value,pSVar6,value_00,alloc);
                goto LAB_0014a21f;
              }
              value.data_.n = (Number)0x0;
              value.data_.s.str = (Ch *)0x3000000000000;
              comp.data_.n = (Number)((long)"opcodeEntry->hasType" + 0xf);
              comp.data_._8_4_ = 5;
              rapidjson::
              GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              ::AddMember<VkStructureType>(&value,(StringRefType *)&comp,create_info->sType,alloc);
              extent.data_.n = (Number)anon_var_dwarf_41790;
              extent.data_._8_4_ = 0x14;
              rapidjson::
              GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              ::AddMember<unsigned_int>
                        (&value,(StringRefType *)&extent,create_info->libraryCount,alloc);
              if (create_info->pLibraries != (VkPipeline *)0x0) {
                range.data_.n = (Number)0x0;
                range.data_.s.str = (Ch *)0x4000000000000;
                for (uVar7 = 0; uVar7 < create_info->libraryCount; uVar7 = uVar7 + 1) {
                  rapidjson::
                  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                  ::PushBack<unsigned_int>
                            ((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                              *)&range,*(uint *)((long)create_info->pLibraries + uVar7 * 4),alloc);
                }
                att.data_.n = (Number)anon_var_dwarf_417b4;
                att.data_._8_4_ = 0x1b;
                rapidjson::
                GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                ::AddMember(&value,(StringRefType *)&att,
                            (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                             *)&range,alloc);
              }
              if (*(uint **)(create_info + 1) != (uint *)0x0) {
                range.data_.n = (Number)anon_var_dwarf_417c0;
                range.data_._8_4_ = 0x19;
                rapidjson::
                GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                ::AddMember<unsigned_int>
                          (&value,(StringRefType *)&range,**(uint **)(create_info + 1),alloc);
              }
              if ((uint *)create_info[1].pNext != (uint *)0x0) {
                discardRectangles.data_.n = (Number)anon_var_dwarf_417cc;
                discardRectangles.data_._8_4_ = 0x1b;
                uVar4 = *create_info[1].pNext;
                pSVar6 = (StringRefType *)&discardRectangles;
                goto LAB_0014a010;
              }
            }
          }
        }
      }
      goto LAB_0014a292;
    }
    value.data_.n = (Number)0x0;
    value.data_.s.str = (Ch *)0x3000000000000;
    comp.data_.n = (Number)((long)"opcodeEntry->hasType" + 0xf);
    comp.data_._8_4_ = 5;
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    AddMember<VkStructureType>(&value,(StringRefType *)&comp,create_info->sType,alloc);
    extent.data_.n = (Number)0x0;
    extent.data_.s.str = (Ch *)0x4000000000000;
    lVar8 = 0;
    for (uVar7 = 0; uVar7 < create_info->libraryCount; uVar7 = uVar7 + 1) {
      range.data_.n = (Number)0x0;
      range.data_.s.str = (Ch *)0x3000000000000;
      att.data_.n = (Number)anon_var_dwarf_4134c;
      att.data_._8_4_ = 7;
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::AddMember<unsigned_int>
                ((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                  *)&range,(StringRefType *)&att,*(uint *)((long)create_info->pLibraries + lVar8),
                 alloc);
      discardRectangles.data_.n = (Number)anon_var_dwarf_415b0;
      discardRectangles.data_._8_4_ = 0x14;
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::AddMember<unsigned_int>
                ((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                  *)&range,(StringRefType *)&discardRectangles,
                 *(uint *)((long)create_info->pLibraries + lVar8 + 4),alloc);
      combinerOps.data_.n = (Number)anon_var_dwarf_40e8d;
      combinerOps.data_._8_4_ = 10;
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::AddMember<unsigned_int>
                ((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                  *)&range,(StringRefType *)&combinerOps,
                 *(uint *)((long)create_info->pLibraries + lVar8 + 8),alloc);
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::PushBack(&extent,(GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                          *)&range,alloc);
      lVar8 = lVar8 + 0xc;
    }
    range.data_.n = (Number)anon_var_dwarf_415a4;
    range.data_._8_4_ = 0x10;
LAB_00149f62:
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    AddMember(&value,(StringRefType *)&range,&extent,alloc);
    next.data_.n = value.data_.n;
    next.data_.s.str = value.data_.s.str;
  }
LAB_0014a29b:
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  PushBack((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
            *)&local_d8.s,&next,alloc);
LAB_0014a2ab:
  pNext = create_info->pNext;
  goto LAB_00147f44;
}

Assistant:

static bool pnext_chain_json_value(const void *pNext, Allocator &alloc, Value *out_value,
                                   const DynamicStateInfo *dynamic_state_info)
{
	Value nexts(kArrayType);

	while ((pNext = pnext_chain_skip_ignored_entries(pNext)) != nullptr)
	{
		auto *pin = static_cast<const VkBaseInStructure *>(pNext);
		bool ignored = false;
		Value next;

		switch (pin->sType)
		{
		case VK_STRUCTURE_TYPE_PIPELINE_TESSELLATION_DOMAIN_ORIGIN_STATE_CREATE_INFO:
			if (!json_value(*static_cast<const VkPipelineTessellationDomainOriginStateCreateInfo *>(pNext), alloc, &next))
				return false;
			break;

		case VK_STRUCTURE_TYPE_PIPELINE_VERTEX_INPUT_DIVISOR_STATE_CREATE_INFO_KHR:
			if (!json_value(*static_cast<const VkPipelineVertexInputDivisorStateCreateInfoKHR *>(pNext), alloc, &next))
				return false;
			break;

		case VK_STRUCTURE_TYPE_PIPELINE_RASTERIZATION_DEPTH_CLIP_STATE_CREATE_INFO_EXT:
			if (!json_value(*static_cast<const VkPipelineRasterizationDepthClipStateCreateInfoEXT *>(pNext), alloc, &next))
				return false;
			break;

		case VK_STRUCTURE_TYPE_PIPELINE_RASTERIZATION_STATE_STREAM_CREATE_INFO_EXT:
			if (!json_value(*static_cast<const VkPipelineRasterizationStateStreamCreateInfoEXT *>(pNext), alloc, &next))
				return false;
			break;

		case VK_STRUCTURE_TYPE_RENDER_PASS_MULTIVIEW_CREATE_INFO:
			if (!json_value(*static_cast<const VkRenderPassMultiviewCreateInfo *>(pNext), alloc, &next))
				return false;
			break;

		case VK_STRUCTURE_TYPE_DESCRIPTOR_SET_LAYOUT_BINDING_FLAGS_CREATE_INFO_EXT:
			if (!json_value(*static_cast<const VkDescriptorSetLayoutBindingFlagsCreateInfoEXT *>(pNext), alloc, &next))
				return false;
			break;

		case VK_STRUCTURE_TYPE_PIPELINE_COLOR_BLEND_ADVANCED_STATE_CREATE_INFO_EXT:
			if (!json_value(*static_cast<const VkPipelineColorBlendAdvancedStateCreateInfoEXT *>(pNext), alloc, &next))
				return false;
			break;

		case VK_STRUCTURE_TYPE_PIPELINE_RASTERIZATION_CONSERVATIVE_STATE_CREATE_INFO_EXT:
			if (!json_value(*static_cast<const VkPipelineRasterizationConservativeStateCreateInfoEXT *>(pNext), alloc, &next))
				return false;
			break;

		case VK_STRUCTURE_TYPE_PIPELINE_RASTERIZATION_LINE_STATE_CREATE_INFO_KHR:
			if (!json_value(*static_cast<const VkPipelineRasterizationLineStateCreateInfoKHR *>(pNext), alloc, &next))
				return false;
			break;

		case VK_STRUCTURE_TYPE_PIPELINE_SHADER_STAGE_REQUIRED_SUBGROUP_SIZE_CREATE_INFO_EXT:
			if (!json_value(*static_cast<const VkPipelineShaderStageRequiredSubgroupSizeCreateInfoEXT *>(pNext), alloc, &next))
				return false;
			break;

		case VK_STRUCTURE_TYPE_MUTABLE_DESCRIPTOR_TYPE_CREATE_INFO_EXT:
			if (!json_value(*static_cast<const VkMutableDescriptorTypeCreateInfoEXT *>(pNext), alloc, &next))
				return false;
			break;

		case VK_STRUCTURE_TYPE_ATTACHMENT_DESCRIPTION_STENCIL_LAYOUT:
			if (!json_value(*static_cast<const VkAttachmentDescriptionStencilLayout *>(pNext), alloc, &next))
				return false;
			break;

		case VK_STRUCTURE_TYPE_ATTACHMENT_REFERENCE_STENCIL_LAYOUT:
			if (!json_value(*static_cast<const VkAttachmentReferenceStencilLayout *>(pNext), alloc, &next))
				return false;
			break;

		case VK_STRUCTURE_TYPE_SUBPASS_DESCRIPTION_DEPTH_STENCIL_RESOLVE:
			if (!json_value(*static_cast<const VkSubpassDescriptionDepthStencilResolve *>(pNext), alloc, &next))
				return false;
			break;

		case VK_STRUCTURE_TYPE_FRAGMENT_SHADING_RATE_ATTACHMENT_INFO_KHR:
			if (!json_value(*static_cast<const VkFragmentShadingRateAttachmentInfoKHR *>(pNext), alloc, &next))
				return false;
			break;

		case VK_STRUCTURE_TYPE_PIPELINE_RENDERING_CREATE_INFO_KHR:
			if (!json_value(*static_cast<const VkPipelineRenderingCreateInfoKHR *>(pNext), alloc, &next))
				return false;
			break;

		case VK_STRUCTURE_TYPE_PIPELINE_COLOR_WRITE_CREATE_INFO_EXT:
			if (!json_value(*static_cast<const VkPipelineColorWriteCreateInfoEXT *>(pNext), alloc, &next, dynamic_state_info))
				return false;
			break;

		case VK_STRUCTURE_TYPE_PIPELINE_SAMPLE_LOCATIONS_STATE_CREATE_INFO_EXT:
			if (!json_value(*static_cast<const VkPipelineSampleLocationsStateCreateInfoEXT *>(pNext), alloc, &next, dynamic_state_info))
				return false;
			break;

		case VK_STRUCTURE_TYPE_PIPELINE_RASTERIZATION_PROVOKING_VERTEX_STATE_CREATE_INFO_EXT:
			if (!json_value(*static_cast<const VkPipelineRasterizationProvokingVertexStateCreateInfoEXT *>(pNext), alloc, &next))
				return false;
			break;

		case VK_STRUCTURE_TYPE_SAMPLER_CUSTOM_BORDER_COLOR_CREATE_INFO_EXT:
			if (!json_value(*static_cast<const VkSamplerCustomBorderColorCreateInfoEXT *>(pNext), alloc, &next))
				return false;
			break;

		case VK_STRUCTURE_TYPE_SAMPLER_REDUCTION_MODE_CREATE_INFO:
			if (!json_value(*static_cast<const VkSamplerReductionModeCreateInfo *>(pNext), alloc, &next))
				return false;
			break;

		case VK_STRUCTURE_TYPE_RENDER_PASS_INPUT_ATTACHMENT_ASPECT_CREATE_INFO:
			if (!json_value(*static_cast<const VkRenderPassInputAttachmentAspectCreateInfo *>(pNext), alloc, &next))
				return false;
			break;

		case VK_STRUCTURE_TYPE_PIPELINE_DISCARD_RECTANGLE_STATE_CREATE_INFO_EXT:
			if (!json_value(*static_cast<const VkPipelineDiscardRectangleStateCreateInfoEXT *>(pNext), alloc, &next, dynamic_state_info))
				return false;
			break;

		case VK_STRUCTURE_TYPE_MEMORY_BARRIER_2_KHR:
			if (!json_value(*static_cast<const VkMemoryBarrier2KHR *>(pNext), alloc, &next))
				return false;
			break;

		case VK_STRUCTURE_TYPE_PIPELINE_FRAGMENT_SHADING_RATE_STATE_CREATE_INFO_KHR:
			if (!json_value(*static_cast<const VkPipelineFragmentShadingRateStateCreateInfoKHR *>(pNext), alloc, &next, dynamic_state_info))
				return false;
			break;

		case VK_STRUCTURE_TYPE_SAMPLER_YCBCR_CONVERSION_CREATE_INFO:
			if (!json_value(*static_cast<const VkSamplerYcbcrConversionCreateInfo *>(pNext), alloc, &next))
				return false;
			break;

		case VK_STRUCTURE_TYPE_GRAPHICS_PIPELINE_LIBRARY_CREATE_INFO_EXT:
			if (!json_value(*static_cast<const VkGraphicsPipelineLibraryCreateInfoEXT *>(pNext), alloc, &next))
				return false;
			break;

		case VK_STRUCTURE_TYPE_SHADER_MODULE_CREATE_INFO:
		case VK_STRUCTURE_TYPE_PIPELINE_SHADER_STAGE_MODULE_IDENTIFIER_CREATE_INFO_EXT:
			// Ignored.
			ignored = true;
			break;

		case VK_STRUCTURE_TYPE_PIPELINE_LIBRARY_CREATE_INFO_KHR:
			if (!json_value(*static_cast<const VkPipelineLibraryCreateInfoKHR *>(pNext), alloc, true, &next))
				return false;
			break;

		case VK_STRUCTURE_TYPE_PIPELINE_VIEWPORT_DEPTH_CLIP_CONTROL_CREATE_INFO_EXT:
			if (!json_value(*static_cast<const VkPipelineViewportDepthClipControlCreateInfoEXT *>(pNext), alloc, &next))
				return false;
			break;

		case VK_STRUCTURE_TYPE_PIPELINE_CREATE_FLAGS_2_CREATE_INFO_KHR:
			if (!json_value(*static_cast<const VkPipelineCreateFlags2CreateInfoKHR *>(pNext), alloc, &next))
				return false;
			break;

		case VK_STRUCTURE_TYPE_RENDER_PASS_CREATION_CONTROL_EXT:
			if (!json_value(*static_cast<const VkRenderPassCreationControlEXT *>(pNext), alloc, &next))
				return false;
			break;

		case VK_STRUCTURE_TYPE_SAMPLER_BORDER_COLOR_COMPONENT_MAPPING_CREATE_INFO_EXT:
			if (!json_value(*static_cast<const VkSamplerBorderColorComponentMappingCreateInfoEXT *>(pNext), alloc, &next))
				return false;
			break;

		case VK_STRUCTURE_TYPE_MULTISAMPLED_RENDER_TO_SINGLE_SAMPLED_INFO_EXT:
			if (!json_value(*static_cast<const VkMultisampledRenderToSingleSampledInfoEXT *>(pNext), alloc, &next))
				return false;
			break;

		case VK_STRUCTURE_TYPE_DEPTH_BIAS_REPRESENTATION_INFO_EXT:
			if (!json_value(*static_cast<const VkDepthBiasRepresentationInfoEXT *>(pNext), alloc, &next))
				return false;
			break;

		case VK_STRUCTURE_TYPE_RENDER_PASS_FRAGMENT_DENSITY_MAP_CREATE_INFO_EXT:
			if (!json_value(*static_cast<const VkRenderPassFragmentDensityMapCreateInfoEXT *>(pNext), alloc, &next))
				return false;
			break;

		case VK_STRUCTURE_TYPE_SAMPLE_LOCATIONS_INFO_EXT:
			if (!json_value(*static_cast<const VkSampleLocationsInfoEXT *>(pNext), alloc, &next))
				return false;
			break;

		case VK_STRUCTURE_TYPE_PIPELINE_ROBUSTNESS_CREATE_INFO_EXT:
			if (!json_value(*static_cast<const VkPipelineRobustnessCreateInfoEXT *>(pNext), alloc, &next))
				return false;
			break;

		case VK_STRUCTURE_TYPE_PIPELINE_VIEWPORT_DEPTH_CLAMP_CONTROL_CREATE_INFO_EXT:
			if (!json_value(*static_cast<const VkPipelineViewportDepthClampControlCreateInfoEXT *>(pNext), alloc, &next))
				return false;
			break;

		case VK_STRUCTURE_TYPE_RENDERING_ATTACHMENT_LOCATION_INFO_KHR:
			if (!json_value(*static_cast<const VkRenderingAttachmentLocationInfoKHR *>(pNext), alloc, &next))
				return false;
			break;

		case VK_STRUCTURE_TYPE_RENDERING_INPUT_ATTACHMENT_INDEX_INFO_KHR:
			if (!json_value(*static_cast<const VkRenderingInputAttachmentIndexInfoKHR *>(pNext), alloc, &next))
				return false;
			break;

		default:
			log_error_pnext_chain("Unsupported pNext found, cannot hash sType.", pNext);
			return false;
		}

		if (!ignored)
			nexts.PushBack(next, alloc);
		pNext = pin->pNext;
	}

	*out_value = nexts;
	return true;
}